

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_42(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  double dVar1;
  byte bVar2;
  bool bVar3;
  __type_conflict1 _Var4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar6;
  long lVar7;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  const_reference pvVar8;
  QPDFObjectHandle local_f48;
  QPDFObjGen local_f38;
  QPDFObjectHandle local_f30;
  QPDFObjectHandle local_f20;
  string local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0;
  Pl_Buffer local_e90 [8];
  Pl_Buffer pl1;
  string local_e58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e18;
  QPDFObjGen local_df8;
  QPDFObjectHandle local_df0;
  QPDFObjGen local_de0;
  QPDFObjGen local_dd8;
  QPDFObjGen indirect_og;
  QPDFObjectHandle indirect;
  QPDFObjectHandle uninitialized;
  undefined1 local_da0 [48];
  QPDFObjectHandle local_d70;
  QPDFObjectHandle local_d60;
  undefined1 local_d50 [48];
  QPDFObjectHandle local_d20;
  QPDFObjectHandle local_d10;
  undefined1 local_d00 [48];
  QPDFObjectHandle local_cd0;
  QPDFObjectHandle local_cc0;
  undefined1 local_cb0 [48];
  QPDFObjectHandle local_c80;
  undefined1 local_c70 [48];
  QPDFMatrix local_c40 [48];
  QPDFObjectHandle local_c10;
  double local_c00;
  Matrix m1;
  undefined1 local_ba0 [8];
  QPDFObjectHandle matrix;
  QPDFObjectHandle local_b60;
  QPDFObjectHandle local_b50;
  undefined8 local_b40;
  double local_b38;
  double local_b30;
  double local_b28;
  QPDFObjectHandle local_b20;
  QPDFObjectHandle local_b10;
  undefined8 local_b00;
  double local_af8;
  double local_af0;
  double local_ae8;
  QPDFObjectHandle local_ae0;
  double local_ad0;
  Rectangle r1;
  undefined1 local_a90 [8];
  QPDFObjectHandle rect;
  Rectangle r0;
  string local_a58 [39];
  allocator<char> local_a31;
  string local_a30 [32];
  QPDFObjectHandle local_a10;
  QPDFObjectHandle local_a00;
  QPDFObjectHandle local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  undefined1 local_9c0 [8];
  QPDFObjectHandle page;
  string local_9a8 [32];
  QPDFObjectHandle local_988;
  QPDFObjectHandle local_978;
  QPDFObjectHandle local_968;
  string local_958 [32];
  QPDFObjectHandle local_938;
  string local_928 [39];
  allocator<char> local_901;
  string local_900 [32];
  QPDFObjectHandle local_8e0;
  QPDFObjectHandle local_8d0;
  QPDFObjectHandle local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  allocator<char> local_889;
  string local_888 [32];
  QPDFObjectHandle local_868;
  QPDFObjectHandle local_858;
  QPDFObjectHandle local_848;
  allocator<char> local_831;
  string local_830 [32];
  QPDFObjectHandle local_810;
  QPDFObjectHandle local_800;
  QPDFObjectHandle local_7f0;
  allocator<char> local_7d9;
  string local_7d8 [32];
  QPDFObjectHandle local_7b8;
  string local_7a8 [39];
  allocator<char> local_781;
  string local_780 [32];
  QPDFObjectHandle local_760;
  string local_750 [32];
  QPDFObjectHandle local_730;
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  string local_660 [39];
  allocator<char> local_639;
  string local_638 [39];
  allocator<char> local_611;
  string local_610 [32];
  QPDFObjectHandle local_5f0;
  QPDFObjectHandle local_5e0;
  allocator<char> local_5c9;
  string local_5c8 [39];
  allocator<char> local_5a1;
  string local_5a0 [32];
  QPDFObjectHandle local_580;
  QPDFObjectHandle local_570;
  allocator<char> local_559;
  string local_558 [39];
  allocator<char> local_531;
  string local_530 [32];
  QPDFObjectHandle local_510;
  QPDFObjectHandle local_500;
  QPDFObjectHandle local_4f0;
  allocator<char> local_4d9;
  string local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0 [39];
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [32];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_440;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_410;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_3e0;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_3c8;
  QPDFObjectHandle local_3a8;
  QPDFObjectHandle local_398;
  QPDFObjectHandle local_388;
  QPDFObjectHandle local_378;
  QPDFObjectHandle local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  iterator local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  long local_2d0;
  T *i_value_1;
  iterator i_1;
  QPDFDictItems di;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  iterator local_230;
  iterator local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  BaseHandle *local_1c0;
  T *i_value;
  undefined1 local_198 [8];
  iterator i;
  QPDFArrayItems ai;
  undefined1 local_160 [8];
  QPDFObjectHandle null;
  string local_148 [32];
  undefined1 local_128 [8];
  QPDFObjectHandle integer;
  string local_110 [32];
  undefined1 local_f0 [8];
  QPDFObjectHandle dictionary;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  QPDFObjectHandle local_90;
  undefined1 local_80 [8];
  QPDFObjectHandle array;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle qtest;
  char *arg2_local;
  QPDF *pdf_local;
  
  qtest.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/QTest",&local_59);
  QPDFObjectHandle::getKey((string *)local_28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"/Dictionary",&local_b1);
  QPDFObjectHandle::getKey((string *)&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"/Key2",
             (allocator<char> *)
             ((long)&dictionary.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_80);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dictionary.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"/Dictionary",
             (allocator<char> *)
             ((long)&integer.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&integer.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"/Integer",
             (allocator<char> *)
             ((long)&null.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&null.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newNull();
  bVar2 = QPDFObjectHandle::isArray();
  if ((bVar2 & 1) == 0) {
    __assert_fail("array.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x584,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::aitems();
  QPDFObjectHandle::QPDFArrayItems::begin();
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_198);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &i_value,"/Item0");
  if (!bVar3) {
    __assert_fail("i->getName() == \"/Item0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x589,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&i_value);
  local_1c0 = (BaseHandle *)
              QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)local_198);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator--((iterator *)local_198);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_198);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar3 = std::operator==(&local_1e0,"/Item0");
  if (!bVar3) {
    __assert_fail("i->getName() == \"/Item0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x58c,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_198);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_198);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_198);
  QPDFObjectHandle::QPDFArrayItems::end();
  bVar2 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==((iterator *)local_198,&local_208);
  if ((bVar2 & 1) == 0) {
    __assert_fail("i == ai.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x590,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_208);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_198);
  QPDFObjectHandle::QPDFArrayItems::end();
  bVar2 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==((iterator *)local_198,&local_230);
  if ((bVar2 & 1) == 0) {
    __assert_fail("i == ai.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x592,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_230);
  bVar3 = qpdf::BaseHandle::operator_cast_to_bool(local_1c0);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!i_value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x593,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::operator--((iterator *)local_198);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar3 = std::operator==(&local_250,"/Item2");
  if (!bVar3) {
    __assert_fail("i_value.getName() == \"/Item2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x595,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_250);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_198);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar3 = std::operator==(&local_270,"/Item2");
  if (!bVar3) {
    __assert_fail("i->getName() == \"/Item2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x596,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_270);
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_198);
  QPDFObjectHandle::QPDFArrayItems::~QPDFArrayItems
            ((QPDFArrayItems *)
             &i.ivalue.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar2 = QPDFObjectHandle::isDictionary();
  if ((bVar2 & 1) == 0) {
    __assert_fail("dictionary.isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x598,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::ditems();
  QPDFObjectHandle::QPDFDictItems::begin();
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          QPDFObjectHandle::QPDFDictItems::iterator::operator->[abi_cxx11_();
  bVar3 = std::operator==(__lhs,"/Key1");
  if (!bVar3) {
    __assert_fail("i->first == \"/Key1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x59d,"void test_42(QPDF &, const char *)");
  }
  local_2d0 = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
  QPDFObjectHandle::QPDFDictItems::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar3 = std::operator==(&local_2f0,"/Value1");
  if (!bVar3) {
    __assert_fail("i->second.getName() == \"/Value1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x59f,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_2f0);
  QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)&i_value_1);
  QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)&i_value_1);
  QPDFObjectHandle::QPDFDictItems::end();
  bVar2 = QPDFObjectHandle::QPDFDictItems::iterator::operator==((iterator *)&i_value_1,&local_338);
  if ((bVar2 & 1) == 0) {
    __assert_fail("i == di.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a2,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator(&local_338);
  bVar3 = qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)(local_2d0 + 0x20));
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!i_value.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a3,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&i_value_1);
  QPDFObjectHandle::QPDFDictItems::~QPDFDictItems
            ((QPDFDictItems *)
             &i_1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  bVar3 = std::operator==("",&local_358);
  if (!bVar3) {
    __assert_fail("\"\" == qtest.getStringValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a5,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_358);
  QPDFObjectHandle::getArrayItem((int)&local_368);
  QPDFObjectHandle::assertNull();
  QPDFObjectHandle::~QPDFObjectHandle(&local_368);
  QPDFObjectHandle::getArrayItem((int)&local_378);
  QPDFObjectHandle::assertNull();
  QPDFObjectHandle::~QPDFObjectHandle(&local_378);
  QPDFObjectHandle::getArrayItem((int)&local_388);
  QPDFObjectHandle::assertNull();
  QPDFObjectHandle::~QPDFObjectHandle(&local_388);
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_128);
  QPDFObjectHandle::eraseItem((int)local_80);
  QPDFObjectHandle::eraseItem((int)local_80);
  operator____qpdf((char *)&local_398,0x172c0f);
  QPDFObjectHandle::insertItem((int)local_80,(QPDFObjectHandle *)0x2a);
  QPDFObjectHandle::~QPDFObjectHandle(&local_398);
  operator____qpdf((char *)&local_3a8,0x172c0f);
  QPDFObjectHandle::setArrayItem((int)local_80,(QPDFObjectHandle *)0x2a);
  QPDFObjectHandle::~QPDFObjectHandle(&local_3a8);
  QPDFObjectHandle::eraseItem((int)local_128);
  QPDFObjectHandle::insertItem((int)local_128,(QPDFObjectHandle *)0x0);
  local_3c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_3c8);
  QPDFObjectHandle::setArrayFromVector(local_128);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_3c8);
  QPDFObjectHandle::setArrayItem((int)local_128,(QPDFObjectHandle *)0x0);
  iVar5 = QPDFObjectHandle::getArrayNItems();
  if (iVar5 != 0) {
    __assert_fail("0 == integer.getArrayNItems()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b2,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getArrayAsVector();
  bVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty(&local_3e0);
  if (!bVar3) {
    __assert_fail("integer.getArrayAsVector().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b3,"void test_42(QPDF &, const char *)");
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_3e0);
  bVar2 = QPDFObjectHandle::getBoolValue();
  if ((bVar2 & 1) != 0) {
    __assert_fail("false == integer.getBoolValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b4,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getDictAsMap_abi_cxx11_();
  bVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
          ::empty(&local_410);
  if (!bVar3) {
    __assert_fail("integer.getDictAsMap().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b5,"void test_42(QPDF &, const char *)");
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~map(&local_410);
  QPDFObjectHandle::getKeys_abi_cxx11_();
  bVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_440);
  if (!bVar3) {
    __assert_fail("integer.getKeys().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b6,"void test_42(QPDF &, const char *)");
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"/Potato",&local_461);
  bVar2 = QPDFObjectHandle::hasKey((string *)local_128);
  if ((bVar2 & 1) != 0) {
    __assert_fail("false == integer.hasKey(\"/Potato\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b7,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_488,"/Potato",&local_489);
  QPDFObjectHandle::removeKey((string *)local_128);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,"/Potato",&local_4b1);
  QPDFObjectHandle::replaceKey((string *)local_128,(QPDFObjectHandle *)local_4b0);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"/Potato",&local_4d9);
  QPDFObjectHandle::newInteger((longlong)&local_4f0);
  QPDFObjectHandle::replaceKey((string *)local_128,(QPDFObjectHandle *)local_4d8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_4f0);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_530,"/Integer",&local_531);
  QPDFObjectHandle::getKeyIfDict((string *)&local_510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_558,"/Potato",&local_559);
  QPDFObjectHandle::getKeyIfDict((string *)&local_500);
  QPDFObjectHandle::assertNull();
  QPDFObjectHandle::~QPDFObjectHandle(&local_500);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator(&local_559);
  QPDFObjectHandle::~QPDFObjectHandle(&local_510);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator(&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"/Integer",&local_5a1);
  QPDFObjectHandle::getKey((string *)&local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"/Potato",&local_5c9);
  QPDFObjectHandle::getKeyIfDict((string *)&local_570);
  QPDFObjectHandle::~QPDFObjectHandle(&local_570);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  QPDFObjectHandle::~QPDFObjectHandle(&local_580);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_610,"/Integer",&local_611);
  QPDFObjectHandle::getKey((string *)&local_5f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"/Potato",&local_639);
  QPDFObjectHandle::getKey((string *)&local_5e0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_5e0);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  QPDFObjectHandle::~QPDFObjectHandle(&local_5f0);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator(&local_611);
  QPDFObjectHandle::getInlineImageValue_abi_cxx11_();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    __assert_fail("integer.getInlineImageValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5be,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_660);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 0) {
    __assert_fail("0 == dictionary.getIntValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5bf,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar3 = std::operator==("/QPDFFakeName",&local_680);
  if (!bVar3) {
    __assert_fail("\"/QPDFFakeName\" == integer.getName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c0,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_680);
  QPDFObjectHandle::getOperatorValue_abi_cxx11_();
  bVar3 = std::operator==("QPDFFAKE",&local_6a0);
  if (!bVar3) {
    __assert_fail("\"QPDFFAKE\" == integer.getOperatorValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c1,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_6a0);
  QPDFObjectHandle::getRealValue_abi_cxx11_();
  bVar3 = std::operator==("0.0",&local_6c0);
  if (!bVar3) {
    __assert_fail("\"0.0\" == dictionary.getRealValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c2,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_6c0);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    __assert_fail("integer.getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c3,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_6e0);
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    __assert_fail("integer.getUTF8Value().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c4,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_700);
  dVar1 = (double)QPDFObjectHandle::getNumericValue();
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    __assert_fail("0.0 == dictionary.getNumericValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c5,"void test_42(QPDF &, const char *)");
  }
  std::operator<<((ostream *)&std::cerr,"One error\n");
  QPDFObjectHandle::getArrayItem((int)&local_730);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    __assert_fail("array.getArrayItem(0).getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c8,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_720);
  QPDFObjectHandle::~QPDFObjectHandle(&local_730);
  std::operator<<((ostream *)&std::cerr,"One error\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_780,"/Quack",&local_781);
  QPDFObjectHandle::getKey((string *)&local_760);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    __assert_fail("dictionary.getKey(\"/Quack\").getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ca,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_750);
  QPDFObjectHandle::~QPDFObjectHandle(&local_760);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator(&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7d8,"/Quack",&local_7d9);
  QPDFObjectHandle::getKeyIfDict((string *)&local_7b8);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    __assert_fail("dictionary.getKeyIfDict(\"/Quack\").getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cb,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_7a8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_7b8);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  QPDFObjectHandle::getArrayItem((int)&local_7f0);
  bVar2 = QPDFObjectHandle::isDictionary();
  if ((bVar2 & 1) == 0) {
    __assert_fail("array.getArrayItem(1).isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cc,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_7f0);
  QPDFObjectHandle::getArrayItem((int)&local_810);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_830,"/K",&local_831);
  QPDFObjectHandle::getKey((string *)&local_800);
  bVar2 = QPDFObjectHandle::isArray();
  if ((bVar2 & 1) == 0) {
    __assert_fail("array.getArrayItem(1).getKey(\"/K\").isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cd,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_800);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator(&local_831);
  QPDFObjectHandle::~QPDFObjectHandle(&local_810);
  QPDFObjectHandle::getArrayItem((int)&local_868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_888,"/K",&local_889);
  QPDFObjectHandle::getKey((string *)&local_858);
  QPDFObjectHandle::getArrayItem((int)&local_848);
  bVar2 = QPDFObjectHandle::isName();
  if ((bVar2 & 1) == 0) {
    __assert_fail("array.getArrayItem(1).getKey(\"/K\").getArrayItem(0).isName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ce,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_848);
  QPDFObjectHandle::~QPDFObjectHandle(&local_858);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator(&local_889);
  QPDFObjectHandle::~QPDFObjectHandle(&local_868);
  QPDFObjectHandle::getArrayItem((int)&local_8e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_900,"/K",&local_901);
  QPDFObjectHandle::getKey((string *)&local_8d0);
  QPDFObjectHandle::getArrayItem((int)&local_8c0);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar3 = std::operator==("/V",&local_8b0);
  if (!bVar3) {
    __assert_fail("\"/V\" == array.getArrayItem(1).getKey(\"/K\").getArrayItem(0).getName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cf,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_8b0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_8c0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_8d0);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator(&local_901);
  QPDFObjectHandle::~QPDFObjectHandle(&local_8e0);
  std::operator<<((ostream *)&std::cerr,"Two errors\n");
  QPDFObjectHandle::getArrayItem((int)&local_938);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    __assert_fail("array.getArrayItem(16059).getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5d1,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string(local_928);
  QPDFObjectHandle::~QPDFObjectHandle(&local_938);
  std::operator<<((ostream *)&std::cerr,"One error\n");
  QPDFObjectHandle::getArrayItem((int)&local_988);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9a8,"/K",
             (allocator<char> *)
             ((long)&page.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)&local_978);
  QPDFObjectHandle::getArrayItem((int)&local_968);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  std::__cxx11::string::~string(local_958);
  QPDFObjectHandle::~QPDFObjectHandle(&local_968);
  QPDFObjectHandle::~QPDFObjectHandle(&local_978);
  std::__cxx11::string::~string(local_9a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&page.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_988);
  this_00 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  pvVar8 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this_00,0);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_9c0,pvVar8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a30,"/Contents",&local_a31);
  QPDFObjectHandle::getKey((string *)&local_a10);
  QPDFObjectHandle::getDict();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a58,"/Potato",(allocator<char> *)((long)&r0.ury + 7));
  QPDFObjectHandle::getKey((string *)&local_9f0);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar3 = std::operator==("/QPDFFakeName",&local_9e0);
  if (!bVar3) {
    __assert_fail("\"/QPDFFakeName\" == page.getKey(\"/Contents\").getDict().getKey(\"/Potato\").getName()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5d6,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_9e0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_9f0);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r0.ury + 7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_a00);
  QPDFObjectHandle::~QPDFObjectHandle(&local_a10);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator(&local_a31);
  QPDFObjectHandle::getArrayAsRectangle();
  bVar3 = false;
  if (((double)rect.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi == 0.0) &&
     (!NAN((double)rect.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi))) {
    bVar3 = false;
    if ((r0.llx == 0.0) && (!NAN(r0.llx))) {
      bVar3 = false;
      if ((r0.lly == 0.0) && (!NAN(r0.lly))) {
        bVar3 = r0.urx == 0.0;
      }
    }
  }
  if (!bVar3) {
    __assert_fail("(r0.llx == 0) && (r0.lly == 0) && (r0.urx == 0) && (r0.ury == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5d9,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::Rectangle::Rectangle((Rectangle *)&r1.ury,1.2,3.4,5.6,7.8);
  QPDFObjectHandle::newFromRectangle((Rectangle *)local_a90);
  QPDFObjectHandle::getArrayAsRectangle();
  bVar3 = false;
  if ((((((1.19 < local_ad0) && (bVar3 = false, local_ad0 < 1.21)) && (bVar3 = false, 3.39 < r1.llx)
        ) && ((bVar3 = false, r1.llx < 3.41 && (bVar3 = false, 5.59 < r1.lly)))) &&
      (bVar3 = false, r1.lly < 5.61)) && (bVar3 = false, 7.79 < r1.urx)) {
    bVar3 = r1.urx < 7.81;
  }
  if (!bVar3) {
    __assert_fail("(r1.llx > 1.19) && (r1.llx < 1.21) && (r1.lly > 3.39) && (r1.lly < 3.41) && (r1.urx > 5.59) && (r1.urx < 5.61) && (r1.ury > 7.79) && (r1.ury < 7.81)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5df,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&local_ae0,0x173104);
  bVar2 = QPDFObjectHandle::isRectangle();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!\"[1 2 3 4 5]\"_qpdf.isRectangle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e0,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_ae0);
  operator____qpdf((char *)&local_b10,0x173104);
  QPDFObjectHandle::getArrayAsRectangle();
  local_ad0 = (double)local_b00;
  r1.llx = local_af8;
  r1.lly = local_af0;
  r1.urx = local_ae8;
  QPDFObjectHandle::~QPDFObjectHandle(&local_b10);
  bVar3 = false;
  if (((double)rect.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi == 0.0) &&
     (!NAN((double)rect.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi))) {
    bVar3 = false;
    if ((r0.llx == 0.0) && (!NAN(r0.llx))) {
      bVar3 = false;
      if ((r0.lly == 0.0) && (!NAN(r0.lly))) {
        bVar3 = r0.urx == 0.0;
      }
    }
  }
  if (!bVar3) {
    __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e2,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&local_b20,0x17316b);
  bVar2 = QPDFObjectHandle::isRectangle();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!\"[1 2 3]\"_qpdf.isRectangle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e3,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_b20);
  operator____qpdf((char *)&local_b50,0x17316b);
  QPDFObjectHandle::getArrayAsRectangle();
  local_ad0 = (double)local_b40;
  r1.llx = local_b38;
  r1.lly = local_b30;
  r1.urx = local_b28;
  QPDFObjectHandle::~QPDFObjectHandle(&local_b50);
  bVar3 = false;
  if (((double)rect.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi == 0.0) &&
     (!NAN((double)rect.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi))) {
    bVar3 = false;
    if ((r0.llx == 0.0) && (!NAN(r0.llx))) {
      bVar3 = false;
      if ((r0.lly == 0.0) && (!NAN(r0.lly))) {
        bVar3 = r0.urx == 0.0;
      }
    }
  }
  if (!bVar3) {
    __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e5,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&local_b60,0x173191);
  bVar2 = QPDFObjectHandle::isRectangle();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!\"[1 2 false 4]\"_qpdf.isRectangle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e6,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_b60);
  operator____qpdf((char *)&matrix.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   0x173191);
  QPDFObjectHandle::getArrayAsRectangle();
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &matrix.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  bVar3 = false;
  if (((double)rect.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi == 0.0) &&
     (!NAN((double)rect.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi))) {
    bVar3 = false;
    if ((r0.llx == 0.0) && (!NAN(r0.llx))) {
      bVar3 = false;
      if ((r0.lly == 0.0) && (!NAN(r0.lly))) {
        bVar3 = r0.urx == 0.0;
      }
    }
  }
  if (!bVar3) {
    __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e8,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::Matrix::Matrix((Matrix *)&m1.f,1.2,3.4,5.6,7.8,9.1,2.3);
  QPDFObjectHandle::newFromMatrix((Matrix *)local_ba0);
  QPDFObjectHandle::getArrayAsMatrix();
  bVar3 = false;
  if (((((1.19 < local_c00) && (bVar3 = false, local_c00 < 1.21)) && (bVar3 = false, 3.39 < m1.a))
      && (((bVar3 = false, m1.a < 3.41 && (bVar3 = false, 5.59 < m1.b)) &&
          ((bVar3 = false, m1.b < 5.61 &&
           ((bVar3 = false, 7.79 < m1.c && (bVar3 = false, m1.c < 7.81)))))))) &&
     ((bVar3 = false, 9.09 < m1.d && ((bVar3 = false, m1.d < 9.11 && (bVar3 = false, 2.29 < m1.e))))
     )) {
    bVar3 = m1.e < 2.31;
  }
  if (!bVar3) {
    __assert_fail("m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 && m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ef,"void test_42(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isMatrix();
  if ((bVar2 & 1) == 0) {
    __assert_fail("matrix.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f0,"void test_42(QPDF &, const char *)");
  }
  QPDFMatrix::QPDFMatrix(local_c40,1.2,3.4,5.6,7.8,9.1,2.3);
  QPDFObjectHandle::newFromMatrix((QPDFMatrix *)&local_c10);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_ba0,&local_c10);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c10);
  QPDFObjectHandle::getArrayAsMatrix();
  memcpy(&local_c00,local_c70,0x30);
  bVar3 = false;
  if ((((1.19 < local_c00) && (bVar3 = false, local_c00 < 1.21)) && (bVar3 = false, 3.39 < m1.a)) &&
     (((((bVar3 = false, m1.a < 3.41 && (bVar3 = false, 5.59 < m1.b)) &&
        ((bVar3 = false, m1.b < 5.61 &&
         ((bVar3 = false, 7.79 < m1.c && (bVar3 = false, m1.c < 7.81)))))) &&
       (bVar3 = false, 9.09 < m1.d)) &&
      ((bVar3 = false, m1.d < 9.11 && (bVar3 = false, 2.29 < m1.e)))))) {
    bVar3 = m1.e < 2.31;
  }
  if (!bVar3) {
    __assert_fail("m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 && m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f5,"void test_42(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isMatrix();
  if ((bVar2 & 1) == 0) {
    __assert_fail("matrix.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f6,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&local_c80,0x173104);
  bVar2 = QPDFObjectHandle::isMatrix();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!\"[1 2 3 4 5]\"_qpdf.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f7,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_c80);
  operator____qpdf((char *)&local_cc0,0x173104);
  QPDFObjectHandle::getArrayAsMatrix();
  memcpy(&local_c00,local_cb0,0x30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_cc0);
  bVar3 = false;
  if ((local_c00 == 0.0) && (!NAN(local_c00))) {
    bVar3 = false;
    if ((m1.a == 0.0) && (!NAN(m1.a))) {
      bVar3 = false;
      if ((m1.b == 0.0) && (!NAN(m1.b))) {
        bVar3 = false;
        if ((m1.c == 0.0) && (!NAN(m1.c))) {
          bVar3 = false;
          if ((m1.d == 0.0) && (!NAN(m1.d))) {
            bVar3 = m1.e == 0.0;
          }
        }
      }
    }
  }
  if (!bVar3) {
    __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f9,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&local_cd0,0x1732f0);
  bVar2 = QPDFObjectHandle::isMatrix();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!\"[1 2 3 4 5 6 7]\"_qpdf.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5fa,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_cd0);
  operator____qpdf((char *)&local_d10,0x1732f0);
  QPDFObjectHandle::getArrayAsMatrix();
  memcpy(&local_c00,local_d00,0x30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d10);
  bVar3 = false;
  if ((local_c00 == 0.0) && (!NAN(local_c00))) {
    bVar3 = false;
    if ((m1.a == 0.0) && (!NAN(m1.a))) {
      bVar3 = false;
      if ((m1.b == 0.0) && (!NAN(m1.b))) {
        bVar3 = false;
        if ((m1.c == 0.0) && (!NAN(m1.c))) {
          bVar3 = false;
          if ((m1.d == 0.0) && (!NAN(m1.d))) {
            bVar3 = m1.e == 0.0;
          }
        }
      }
    }
  }
  if (!bVar3) {
    __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5fc,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&local_d20,0x173323);
  bVar2 = QPDFObjectHandle::isMatrix();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!\"[1 2 3 false 5 6 7]\"_qpdf.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5fd,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_d20);
  operator____qpdf((char *)&local_d60,0x173323);
  QPDFObjectHandle::getArrayAsMatrix();
  memcpy(&local_c00,local_d50,0x30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d60);
  bVar3 = false;
  if ((local_c00 == 0.0) && (!NAN(local_c00))) {
    bVar3 = false;
    if ((m1.a == 0.0) && (!NAN(m1.a))) {
      bVar3 = false;
      if ((m1.b == 0.0) && (!NAN(m1.b))) {
        bVar3 = false;
        if ((m1.c == 0.0) && (!NAN(m1.c))) {
          bVar3 = false;
          if ((m1.d == 0.0) && (!NAN(m1.d))) {
            bVar3 = m1.e == 0.0;
          }
        }
      }
    }
  }
  if (!bVar3) {
    __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ff,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&local_d70,0x1734c9);
  bVar2 = QPDFObjectHandle::isMatrix();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!\"42\"_qpdf.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x600,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_d70);
  operator____qpdf((char *)&uninitialized.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   0x1734c9);
  QPDFObjectHandle::getArrayAsMatrix();
  memcpy(&local_c00,local_da0,0x30);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &uninitialized.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar3 = false;
  if ((local_c00 == 0.0) && (!NAN(local_c00))) {
    bVar3 = false;
    if ((m1.a == 0.0) && (!NAN(m1.a))) {
      bVar3 = false;
      if ((m1.b == 0.0) && (!NAN(m1.b))) {
        bVar3 = false;
        if ((m1.c == 0.0) && (!NAN(m1.c))) {
          bVar3 = false;
          if ((m1.d == 0.0) && (!NAN(m1.d))) {
            bVar3 = m1.e == 0.0;
          }
        }
      }
    }
  }
  if (!bVar3) {
    __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x602,"void test_42(QPDF &, const char *)");
  }
  this = &indirect.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this);
  bVar3 = qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)this);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!uninitialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x606,"void test_42(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isInteger();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!uninitialized.isInteger()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x607,"void test_42(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isDictionary();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!uninitialized.isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x608,"void test_42(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isScalar();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!uninitialized.isScalar()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x609,"void test_42(QPDF &, const char *)");
  }
  QPDF::newIndirectNull();
  local_dd8 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  local_de0 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&indirect_og);
  QPDFObjectHandle::QPDFObjectHandle(&local_df0,(QPDFObjectHandle *)local_80);
  QPDF::replaceObject((QPDFObjGen)pdf,(QPDFObjectHandle *)local_de0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_df0);
  bVar2 = QPDFObjectHandle::isIndirect();
  if ((bVar2 & 1) == 0) {
    __assert_fail("array.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x60f,"void test_42(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isArray();
  if ((bVar2 & 1) == 0) {
    __assert_fail("indirect.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x610,"void test_42(QPDF &, const char *)");
  }
  local_df8 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar3 = QPDFObjGen::operator==(&local_df8,&local_dd8);
  if (!bVar3) {
    __assert_fail("array.getObjGen() == indirect_og",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x611,"void test_42(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isArray();
  if ((bVar2 & 1) == 0) {
    __assert_fail("array.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x612,"void test_42(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isArray();
  if ((bVar2 & 1) == 0) {
    __assert_fail("indirect.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x613,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  QPDFObjGen::unparse_abi_cxx11_(&local_e58,&local_dd8,' ');
  std::operator+(&local_e38,&local_e58," R");
  _Var4 = std::operator==(&local_e18,&local_e38);
  if (!_Var4) {
    __assert_fail("indirect.unparse() == indirect_og.unparse(\' \') + \" R\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x614,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_e38);
  std::__cxx11::string::~string((string *)&local_e58);
  std::__cxx11::string::~string((string *)&local_e18);
  Pl_Buffer::Pl_Buffer(local_e90,"",(Pipeline *)0x0);
  QPDFObjectHandle::writeJSON((int)local_80,(Pipeline *)0x2,SUB81(local_e90,0),1);
  Pl_Buffer::finish();
  Pl_Buffer::getString_abi_cxx11_();
  QPDFObjGen::unparse_abi_cxx11_(&local_f10,&local_dd8,' ');
  std::operator+(&local_ef0,"\"",&local_f10);
  std::operator+(&local_ed0,&local_ef0," R\"");
  _Var4 = std::operator==(&local_eb0,&local_ed0);
  if (!_Var4) {
    __assert_fail("pl1.getString() == std::string(\"\\\"\" + indirect_og.unparse(\' \') + \" R\\\"\")"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x619,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_ed0);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_f10);
  std::__cxx11::string::~string((string *)&local_eb0);
  operator____qpdf((char *)&local_f20,0x1734c9);
  QPDFObjectHandle::setArrayItem((int)local_80,(QPDFObjectHandle *)0x1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f20);
  QPDFObjectHandle::getArrayItem((int)&local_f30);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 == 0x2a) {
    QPDFObjectHandle::~QPDFObjectHandle(&local_f30);
    local_f38 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&indirect_og);
    operator____qpdf((char *)&local_f48,0x1734c9);
    QPDF::replaceObject((QPDFObjGen)pdf,(QPDFObjectHandle *)local_f38);
    QPDFObjectHandle::~QPDFObjectHandle(&local_f48);
    bVar2 = QPDFObjectHandle::isInteger();
    if ((bVar2 & 1) == 0) {
      __assert_fail("array.isInteger()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0x61f,"void test_42(QPDF &, const char *)");
    }
    Pl_Buffer::~Pl_Buffer(local_e90);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&indirect_og);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &indirect.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_ba0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a90);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_9c0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_160);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_128);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_f0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
    return;
  }
  __assert_fail("indirect.getArrayItem(1).getIntValue() == 42",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x61c,"void test_42(QPDF &, const char *)");
}

Assistant:

static void
test_42(QPDF& pdf, char const* arg2)
{
    // Access objects as wrong type. This test case is crafted to work with object-types.pdf.
    QPDFObjectHandle qtest = pdf.getTrailer().getKey("/QTest");
    QPDFObjectHandle array = qtest.getKey("/Dictionary").getKey("/Key2");
    QPDFObjectHandle dictionary = qtest.getKey("/Dictionary");
    QPDFObjectHandle integer = qtest.getKey("/Integer");
    QPDFObjectHandle null = QPDFObjectHandle::newNull();
    assert(array.isArray());
    {
        // Exercise iterators directly
        auto ai = array.aitems();
        auto i = ai.begin();
        assert(i->getName() == "/Item0");
        auto& i_value = *i;
        --i;
        assert(i->getName() == "/Item0");
        ++i;
        ++i;
        ++i;
        assert(i == ai.end());
        ++i;
        assert(i == ai.end());
        assert(!i_value);
        --i;
        assert(i_value.getName() == "/Item2");
        assert(i->getName() == "/Item2");
    }
    assert(dictionary.isDictionary());
    {
        // Exercise iterators directly
        auto di = dictionary.ditems();
        auto i = di.begin();
        assert(i->first == "/Key1");
        auto& i_value = *i;
        assert(i->second.getName() == "/Value1");
        ++i;
        ++i;
        assert(i == di.end());
        assert(!i_value.second);
    }
    assert("" == qtest.getStringValue());
    array.getArrayItem(-1).assertNull();
    array.getArrayItem(16059).assertNull();
    integer.getArrayItem(0).assertNull();
    integer.appendItem(null);
    array.eraseItem(-1);
    array.eraseItem(16059);
    array.insertItem(42, "/Dontpanic"_qpdf);
    array.setArrayItem(42, "/Dontpanic"_qpdf);
    integer.eraseItem(0);
    integer.insertItem(0, null);
    integer.setArrayFromVector(std::vector<QPDFObjectHandle>());
    integer.setArrayItem(0, null);
    assert(0 == integer.getArrayNItems());
    assert(integer.getArrayAsVector().empty());
    assert(false == integer.getBoolValue());
    assert(integer.getDictAsMap().empty());
    assert(integer.getKeys().empty());
    assert(false == integer.hasKey("/Potato"));
    integer.removeKey("/Potato");
    integer.replaceKey("/Potato", null);
    integer.replaceKey("/Potato", QPDFObjectHandle::newInteger(1));
    null.getKeyIfDict("/Integer").getKeyIfDict("/Potato").assertNull();
    qtest.getKey("/Integer").getKeyIfDict("/Potato");
    qtest.getKey("/Integer").getKey("/Potato");
    assert(integer.getInlineImageValue().empty());
    assert(0 == dictionary.getIntValue());
    assert("/QPDFFakeName" == integer.getName());
    assert("QPDFFAKE" == integer.getOperatorValue());
    assert("0.0" == dictionary.getRealValue());
    assert(integer.getStringValue().empty());
    assert(integer.getUTF8Value().empty());
    assert(0.0 == dictionary.getNumericValue());
    // Make sure error messages are okay for nested values
    std::cerr << "One error\n";
    assert(array.getArrayItem(0).getStringValue().empty());
    std::cerr << "One error\n";
    assert(dictionary.getKey("/Quack").getStringValue().empty());
    assert(dictionary.getKeyIfDict("/Quack").getStringValue().empty());
    assert(array.getArrayItem(1).isDictionary());
    assert(array.getArrayItem(1).getKey("/K").isArray());
    assert(array.getArrayItem(1).getKey("/K").getArrayItem(0).isName());
    assert("/V" == array.getArrayItem(1).getKey("/K").getArrayItem(0).getName());
    std::cerr << "Two errors\n";
    assert(array.getArrayItem(16059).getStringValue().empty());
    std::cerr << "One error\n";
    array.getArrayItem(1).getKey("/K").getArrayItem(0).getStringValue();
    // Stream dictionary
    QPDFObjectHandle page = pdf.getAllPages().at(0);
    assert("/QPDFFakeName" == page.getKey("/Contents").getDict().getKey("/Potato").getName());
    // Rectangle
    QPDFObjectHandle::Rectangle r0 = integer.getArrayAsRectangle();
    assert((r0.llx == 0) && (r0.lly == 0) && (r0.urx == 0) && (r0.ury == 0));
    QPDFObjectHandle rect =
        QPDFObjectHandle::newFromRectangle(QPDFObjectHandle::Rectangle(1.2, 3.4, 5.6, 7.8));
    QPDFObjectHandle::Rectangle r1 = rect.getArrayAsRectangle();
    assert(
        (r1.llx > 1.19) && (r1.llx < 1.21) && (r1.lly > 3.39) && (r1.lly < 3.41) &&
        (r1.urx > 5.59) && (r1.urx < 5.61) && (r1.ury > 7.79) && (r1.ury < 7.81));
    assert(!"[1 2 3 4 5]"_qpdf.isRectangle());
    r1 = "[1 2 3 4 5]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    assert(!"[1 2 3]"_qpdf.isRectangle());
    r1 = "[1 2 3]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    assert(!"[1 2 false 4]"_qpdf.isRectangle());
    r1 = "[1 2 false 4]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    // Matrix
    auto matrix =
        QPDFObjectHandle::newFromMatrix(QPDFObjectHandle::Matrix{1.2, 3.4, 5.6, 7.8, 9.1, 2.3});
    auto m1 = matrix.getArrayAsMatrix();
    assert(
        m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 &&
        m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31);
    assert(matrix.isMatrix());
    matrix = QPDFObjectHandle::newFromMatrix(QPDFMatrix{1.2, 3.4, 5.6, 7.8, 9.1, 2.3});
    m1 = matrix.getArrayAsMatrix();
    assert(
        m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 &&
        m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31);
    assert(matrix.isMatrix());
    assert(!"[1 2 3 4 5]"_qpdf.isMatrix());
    m1 = "[1 2 3 4 5]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"[1 2 3 4 5 6 7]"_qpdf.isMatrix());
    m1 = "[1 2 3 4 5 6 7]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"[1 2 3 false 5 6 7]"_qpdf.isMatrix());
    m1 = "[1 2 3 false 5 6 7]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"42"_qpdf.isMatrix());
    m1 = "42"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);

    // Uninitialized
    QPDFObjectHandle uninitialized;
    assert(!uninitialized);
    assert(!uninitialized.isInteger());
    assert(!uninitialized.isDictionary());
    assert(!uninitialized.isScalar());

    // Reference
    auto indirect = pdf.newIndirectNull();
    QPDFObjGen indirect_og{indirect.getObjGen()};
    pdf.replaceObject(indirect, array);
    assert(array.isIndirect());
    assert(indirect.isArray());
    assert(array.getObjGen() == indirect_og);
    assert(array.isArray());
    assert(indirect.isArray());
    assert(indirect.unparse() == indirect_og.unparse(' ') + " R");

    auto pl1 = Pl_Buffer("");
    array.writeJSON(2, &pl1, true);
    pl1.finish();
    assert(pl1.getString() == std::string("\"" + indirect_og.unparse(' ') + " R\""));

    array.setArrayItem(1, "42"_qpdf);
    assert(indirect.getArrayItem(1).getIntValue() == 42);

    pdf.replaceObject(indirect, "42"_qpdf);
    assert(array.isInteger());
}